

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)> *
__thiscall
testing::internal::
FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
::With(MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
       *__return_storage_ptr__,
      FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
      *this,Matcher<const_pstore::brokerface::fifo_path_&> *m,
      Matcher<const_pstore::broker::broker_command_&> *m_1)

{
  tuple<testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
  local_58;
  Matcher<const_pstore::broker::broker_command_&> *local_28;
  Matcher<const_pstore::broker::broker_command_&> *m_local_1;
  Matcher<const_pstore::brokerface::fifo_path_&> *m_local;
  FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  *this_local;
  
  local_28 = m_1;
  m_local_1 = (Matcher<const_pstore::broker::broker_command_&> *)m;
  m_local = (Matcher<const_pstore::brokerface::fifo_path_&> *)this;
  this_local = (FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
                *)__return_storage_ptr__;
  std::
  make_tuple<testing::Matcher<pstore::brokerface::fifo_path_const&>,testing::Matcher<pstore::broker::broker_command_const&>>
            (&local_58,m,m_1);
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>::
  MockSpec(__return_storage_ptr__,this,&local_58);
  std::
  tuple<testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
  ::~tuple(&local_58);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }